

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

size_t ma_mp3_dr_callback__read(void *pUserData,void *pBufferOut,size_t bytesToRead)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  size_t bytesRead;
  ma_result result;
  ma_mp3 *pMP3;
  size_t local_30 [6];
  
  (**(code **)(in_RDI + 0x48))(*(undefined8 *)(in_RDI + 0x60),in_RSI,in_RDX,local_30);
  return local_30[0];
}

Assistant:

static size_t ma_mp3_dr_callback__read(void* pUserData, void* pBufferOut, size_t bytesToRead)
{
    ma_mp3* pMP3 = (ma_mp3*)pUserData;
    ma_result result;
    size_t bytesRead;

    MA_ASSERT(pMP3 != NULL);

    result = pMP3->onRead(pMP3->pReadSeekTellUserData, pBufferOut, bytesToRead, &bytesRead);
    (void)result;

    return bytesRead;
}